

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
          (Fault *this,char *file,char line [7],Type code,char *condition,char *macroArgs,
          char (*params) [27])

{
  EVP_PKEY_CTX *ctx;
  undefined1 in_register_00000017;
  String *local_b0;
  undefined1 local_48 [8];
  char argValues [1] [7];
  char *local_30;
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  char *file_local;
  Fault_conflict *this_local;
  
  condition_local._4_4_ = line._0_4_;
  this->exception = (Exception *)0x0;
  local_30 = macroArgs;
  macroArgs_local = condition;
  condition_local._0_4_ = code;
  _code_local = (EVP_PKEY_CTX *)file;
  file_local = (char *)this;
  str<char_const(&)[27]>
            ((String *)local_48,(kj *)params,(char (*) [27])CONCAT17(in_register_00000017,line));
  ctx = _code_local;
  arrayPtr<kj::String>((String *)local_48,1);
  init(this,ctx);
  local_b0 = (String *)&stack0xffffffffffffffd0;
  do {
    local_b0 = local_b0 + -1;
    String::~String(local_b0);
  } while (local_b0 != (String *)local_48);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}